

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::NavigationBar::showScreen(NavigationBar *this,QWidget *s)

{
  Type *text;
  Data *dd;
  QStackedWidget *pQVar1;
  Data *dd_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar5;
  int *piVar6;
  NavigationBarPrivate *pNVar7;
  QWidget *local_40;
  QWidget *local_38;
  
  local_40 = s;
  bVar2 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::contains
                    (&((this->d).d)->itemsMap,&local_40);
  if (!bVar2) {
    return;
  }
  iVar3 = currentIndex(this);
  if (iVar3 == -1) {
    return;
  }
  pQVar5 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&((this->d).d)->itemsMap,&local_40);
  text = pQVar5->value;
  dd = pQVar5->d;
  if (dd != (Data *)0x0) {
    LOCK();
    (dd->weakref)._q_value.super___atomic_base<int>._M_i =
         (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (dd->strongref)._q_value.super___atomic_base<int>._M_i =
         (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pNVar7 = (this->d).d;
  pQVar1 = pNVar7->stack;
  currentIndex(this);
  local_38 = (QWidget *)QStackedWidget::widget((int)pQVar1);
  pQVar5 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&pNVar7->itemsMap,&local_38);
  dd_00 = pQVar5->d;
  if (dd_00 != (Data *)0x0) {
    LOCK();
    (dd_00->weakref)._q_value.super___atomic_base<int>._M_i =
         (dd_00->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (dd_00->strongref)._q_value.super___atomic_base<int>._M_i =
         (dd_00->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pNVar7 = (this->d).d;
  if ((pNVar7->backStack).super_QList<int>.d.size != 0) {
    piVar6 = QStack<int>::top(&pNVar7->backStack);
    iVar3 = *piVar6;
    iVar4 = currentIndex(this);
    if (iVar3 == iVar4) goto LAB_0017d3c5;
    pNVar7 = (this->d).d;
  }
  iVar3 = currentIndex(this);
  QList<int>::append(&(pNVar7->backStack).super_QList<int>,iVar3);
  QAbstractButton::setText((QString *)((this->d).d)->left);
  QWidget::show();
LAB_0017d3c5:
  QList<int>::clear(&(((this->d).d)->forwardStack).super_QList<int>);
  QWidget::hide();
  TextLabel::setText(((this->d).d)->title,&text->title);
  QStackedWidget::setCurrentWidget((QWidget *)((this->d).d)->stack);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(dd_00);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(dd);
  return;
}

Assistant:

void
NavigationBar::showScreen( QWidget * s )
{
	if( d->itemsMap.contains( s ) && currentIndex() != -1 )
	{
		QSharedPointer< NavigationItem > nextItem = d->itemsMap[ s ];
		QSharedPointer< NavigationItem > currentItem =
			d->itemsMap[ d->stack->widget( currentIndex() ) ];

		if( d->backStack.isEmpty() || d->backStack.top() != currentIndex() )
		{
			d->backStack.push( currentIndex() );

			d->left->setText( currentItem->title );
			d->left->show();
		}

		d->forwardStack.clear();
		d->right->hide();

		d->title->setText( nextItem->title );

		d->stack->setCurrentWidget( nextItem->self );
	}
}